

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void instance_destroy(Instance *instance)

{
  if (instance->name != (char *)0x0) {
    free(instance->name);
  }
  if (instance->comment != (char *)0x0) {
    free(instance->comment);
  }
  free(instance->positions);
  free(instance->demands);
  free(instance->profits);
  free(instance->edge_weight);
  instance->demands = (double *)0x0;
  instance->profits = (double *)0x0;
  *(undefined8 *)&instance->rounding_strat = 0;
  instance->positions = (Vec2d *)0x0;
  instance->num_customers = 0;
  instance->num_vehicles = 0;
  instance->vehicle_cap = 0.0;
  instance->name = (char *)0x0;
  instance->comment = (char *)0x0;
  instance->edge_weight = (double *)0x0;
  return;
}

Assistant:

void instance_destroy(Instance *instance) {
    if (instance->name) {
        free(instance->name);
    }

    if (instance->comment) {
        free(instance->comment);
    }

    free(instance->positions);
    free(instance->demands);
    free(instance->profits);
    free(instance->edge_weight);

    memset(instance, 0, sizeof(*instance));
}